

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

char * ValidateLabel(char *naam,bool setNameSpace,bool ignoreCharAfter)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char **ppcVar4;
  size_t sVar5;
  char *__dest;
  size_t sVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  
  if (naam == (char *)0x0) {
    Error("Invalid labelname",(char *)0x0,PASS3);
    return (char *)0x0;
  }
  bVar11 = *naam == '!';
  pcVar9 = naam + bVar11;
  cVar10 = naam[bVar11];
  if ((cVar10 != '@' || (macrolabp == (char *)0x0 || (bVar11 || !setNameSpace))) ||
     (pcVar9[1] != '.')) {
    bVar1 = 1;
  }
  else {
    pcVar9 = pcVar9 + 1;
    cVar10 = '.';
    bVar1 = 0;
  }
  bVar2 = isLabelStart(pcVar9,true);
  pcVar9 = pcVar9 + (cVar10 == '.' || cVar10 == '@');
  if (bVar2) {
    if ((bool)(bVar1 & cVar10 == '.')) {
      bVar12 = macrolabp != (char *)0x0;
LAB_0012fce9:
      bVar2 = bVar12;
      bVar12 = false;
    }
    else {
      bVar2 = false;
      bVar12 = false;
      if (cVar10 == '.') goto LAB_0012fce9;
      bVar12 = false;
      if (cVar10 != '@') {
        bVar12 = ModuleName[0] != '\0';
        bVar2 = false;
      }
    }
    lVar7 = 0;
    do {
      lVar8 = lVar7;
      iVar3 = islabchar(pcVar9[lVar8]);
      lVar7 = lVar8 + 1;
    } while (iVar3 != 0);
    if (pcVar9[lVar8] != '\0') {
      if (pcVar9[lVar8] == '[') goto LAB_0012fd65;
      if (!ignoreCharAfter) goto LAB_0012fd51;
    }
    iVar3 = (int)lVar8;
    if (0x40 < iVar3) {
      Error("Label too long",pcVar9,IF_FIRST);
    }
    if (cVar10 == '.' || bVar2 != false) {
      if (bVar2 == false) {
        ppcVar4 = &vorlabp;
      }
      else {
        ppcVar4 = &macrolabp;
      }
      sVar5 = strlen(*ppcVar4);
      iVar3 = (int)(lVar8 + 1) + (int)sVar5;
    }
    if (bVar12) {
      sVar5 = strlen(ModuleName);
      iVar3 = iVar3 + (int)sVar5 + 1;
    }
    __dest = (char *)operator_new__((long)(iVar3 + 1));
    *__dest = '\0';
    sVar5 = (size_t)iVar3;
    if (bVar12) {
      strncat(__dest,ModuleName,sVar5);
      sVar6 = strlen(__dest);
      (__dest + sVar6)[0] = '.';
      (__dest + sVar6)[1] = '\0';
    }
    if ((cVar10 == '.' | bVar2) == 1) {
      if (bVar2 == false) {
        ppcVar4 = &vorlabp;
      }
      else {
        ppcVar4 = &macrolabp;
      }
      strncat(__dest,*ppcVar4,sVar5);
      sVar6 = strlen(__dest);
      *(ushort *)(__dest + sVar6) = (ushort)bVar2 << 4 | 0x2e;
    }
    sVar6 = strlen(__dest);
    lVar7 = 0;
    do {
      iVar3 = islabchar(pcVar9[lVar7]);
      if (iVar3 == 0) break;
      __dest[lVar7 + sVar6] = pcVar9[lVar7];
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 0x40);
    __dest[lVar7 + sVar6] = '\0';
    if ((long)sVar5 < (long)(__dest + lVar7 + sVar6) - (long)__dest) {
      Error("internal error",(char *)0x0,FATAL);
    }
    if ((!bVar11 && setNameSpace) && (cVar10 != '.')) {
      free(vorlabp);
      vorlabp = strdup(__dest);
      if (vorlabp == (char *)0x0) {
        ErrorOOM();
      }
    }
  }
  else {
LAB_0012fd51:
    Error("Invalid labelname",pcVar9,PASS3);
LAB_0012fd65:
    __dest = (char *)0x0;
  }
  return __dest;
}

Assistant:

char* ValidateLabel(const char* naam, bool setNameSpace, bool ignoreCharAfter) {
	if (nullptr == naam) {
		Error("Invalid labelname");
		return nullptr;
	}
	if ('!' == *naam) {
		setNameSpace = false;
		++naam;
	}
	// check if local label defined inside macro wants to become non-macro local label
	const bool escMacro = setNameSpace && macrolabp && ('@' == naam[0]) && ('.' == naam[1]);
	if (escMacro) ++naam;			// such extra "@" is consumed right here and only '.' is left
	// regular single prefix case in other use cases
	const bool global = '@' == *naam;
	const bool local = '.' == *naam;
	if (!isLabelStart(naam)) {		// isLabelStart assures that only single modifier exist
		if (global || local) ++naam;// single modifier is parsed (even when invalid name)
		Error("Invalid labelname", naam);
		return nullptr;
	}
	if (global || local) ++naam;	// single modifier is parsed
	const bool inMacro = !escMacro && local && macrolabp;
	const bool inModule = !inMacro && !global && !local && ModuleName[0];
	// check all chars of label
	const char* np = naam;
	while (islabchar(*np)) ++np;
	if ('[' == *np) return nullptr;	// this is DEFARRAY name, do not process it as label (silent exit)
	if (*np && !ignoreCharAfter) {
		// if this is supposed to be new label, there shoulnd't be anything else after it
		Error("Invalid labelname", naam);
		return nullptr;
	}
	// calculate expected length of fully qualified label name
	int labelLen = (np - naam), truncateAt = LABMAX;
	if (LABMAX < labelLen) Error("Label too long", naam, IF_FIRST);	// non-fatal error, will truncate it
	if (inMacro) labelLen += 1 + strlen(macrolabp);
	else if (local) labelLen += 1 + strlen(vorlabp);
	if (inModule) labelLen += 1 + strlen(ModuleName);
	// build fully qualified label name (in newly allocated memory buffer, with precise length)
	char* const label = new char[1+labelLen];
	if (nullptr == label) ErrorOOM();
	label[0] = 0;
	if (inModule) {
		STRCAT(label, labelLen, ModuleName);	STRCAT(label, 2, ".");
	}
	if (inMacro) {
		STRCAT(label, labelLen, macrolabp);		STRCAT(label, 2, ">");
	} else if (local) {
		STRCAT(label, labelLen, vorlabp);		STRCAT(label, 2, ".");
	}
	char* lp = label + strlen(label);
	while (truncateAt-- && islabchar(*naam)) *lp++ = *naam++;	// add the new label (truncated if needed)
	*lp = 0;
	if (labelLen < lp - label) Error("internal error", nullptr, FATAL);		// should never happen :)
	if (setNameSpace && !local) {
		free(vorlabp);
		vorlabp = STRDUP(label);
		if (vorlabp == NULL) ErrorOOM();
	}
	return label;
}